

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer
          (basic_memory_buffer<char,_250UL,_std::allocator<char>_> *this)

{
  char *pcVar1;
  
  (this->super_buffer<char>)._vptr_buffer = (_func_int **)&PTR_grow_001b51d8;
  pcVar1 = (this->super_buffer<char>).ptr_;
  if (pcVar1 != this->store_) {
    operator_delete(pcVar1,(this->super_buffer<char>).capacity_);
  }
  operator_delete(this,0x120);
  return;
}

Assistant:

~basic_memory_buffer() FMT_OVERRIDE { deallocate(); }